

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O1

void anon_unknown.dwarf_b5b72::testRSMatrix(M44f *M,V3f *t,V3f *r,V3f *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  M44f local_68;
  
  local_68.x[0][0] = 1.0;
  local_68.x[0][1] = 0.0;
  local_68.x[0][2] = 0.0;
  local_68.x[0][3] = 0.0;
  local_68.x[1][0] = 0.0;
  local_68.x[1][1] = 1.0;
  local_68.x[1][2] = 0.0;
  local_68.x[1][3] = 0.0;
  local_68.x[2][0] = 0.0;
  local_68.x[2][1] = 0.0;
  local_68.x[2][2] = 1.0;
  local_68.x[2][3] = 0.0;
  fVar6 = t->x;
  fVar8 = t->y;
  fVar9 = t->z;
  local_68.x[3][0] = fVar9 * 0.0 + fVar8 * 0.0 + fVar6 + 0.0;
  local_68.x[3][1] = fVar9 * 0.0 + fVar6 * 0.0 + fVar8 + 0.0;
  local_68.x[3][2] = fVar6 * 0.0 + fVar8 * 0.0 + fVar9 + 0.0;
  local_68.x[3][3] = fVar9 * 0.0 + fVar6 * 0.0 + fVar8 * 0.0 + 1.0;
  fVar6 = cosf(r->z);
  fVar7 = cosf(r->y);
  fVar8 = cosf(r->x);
  fVar9 = sinf(r->z);
  fVar10 = sinf(r->y);
  fVar11 = sinf(r->x);
  fVar14 = fVar6 * fVar7;
  fVar18 = fVar7 * fVar9;
  fVar13 = fVar6 * fVar10 * fVar11 - fVar9 * fVar8;
  fVar17 = fVar6 * fVar8 + fVar9 * fVar10 * fVar11;
  fVar15 = fVar7 * fVar11;
  fVar21 = fVar9 * fVar11 + fVar8 * fVar6 * fVar10;
  fVar12 = fVar8 * fVar9 * fVar10 - fVar6 * fVar11;
  fVar7 = fVar7 * fVar8;
  fVar11 = local_68.x[0][1];
  fVar1 = local_68.x[0][2];
  fVar2 = local_68.x[0][3];
  fVar3 = local_68.x[1][0];
  fVar4 = local_68.x[1][2];
  fVar5 = local_68.x[1][3];
  fVar19 = fVar18 * local_68.x[1][0];
  fVar20 = fVar10 * local_68.x[2][0];
  fVar6 = s->x;
  local_68.x[0][2] =
       fVar6 * ((fVar14 * local_68.x[0][2] + fVar18 * local_68.x[1][2]) - fVar10 * local_68.x[2][2])
  ;
  local_68.x[0][1] =
       fVar6 * ((fVar14 * local_68.x[0][1] + fVar18 * local_68.x[1][1]) - fVar10 * local_68.x[2][1])
  ;
  fVar9 = fVar13 * local_68.x[0][3];
  fVar16 = fVar15 * local_68.x[2][1];
  fVar8 = s->y;
  local_68.x[1][0] =
       fVar8 * (fVar15 * local_68.x[2][0] + fVar13 * local_68.x[0][0] + fVar17 * local_68.x[1][0]);
  local_68.x[0][3] =
       fVar6 * ((fVar14 * local_68.x[0][3] + fVar18 * local_68.x[1][3]) - fVar10 * local_68.x[2][3])
  ;
  local_68.x[1][3] = fVar8 * (fVar15 * local_68.x[2][3] + fVar9 + fVar17 * local_68.x[1][3]);
  local_68.x[1][2] =
       fVar8 * (fVar15 * local_68.x[2][2] + fVar13 * fVar1 + fVar17 * local_68.x[1][2]);
  fVar9 = s->z;
  local_68.x[2][2] = fVar9 * (fVar7 * local_68.x[2][2] + fVar21 * fVar1 + fVar12 * fVar4);
  local_68.x[2][3] = fVar9 * (fVar7 * local_68.x[2][3] + fVar21 * fVar2 + fVar12 * fVar5);
  local_68.x[2][1] =
       fVar9 * (fVar7 * local_68.x[2][1] + fVar21 * fVar11 + fVar12 * local_68.x[1][1]);
  local_68.x[2][0] = fVar9 * (fVar7 * local_68.x[2][0] + fVar21 * local_68.x[0][0] + fVar12 * fVar3)
  ;
  local_68.x[0][0] = fVar6 * ((fVar14 * local_68.x[0][0] + fVar19) - fVar20);
  local_68.x[1][1] = fVar8 * (fVar16 + fVar13 * fVar11 + fVar17 * local_68.x[1][1]);
  compareMat(M,&local_68);
  return;
}

Assistant:

void
testRSMatrix (M44f& M, V3f& t, V3f& r, V3f& s)
{
    M44f N;
    N.makeIdentity ();
    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.scale (s);

    compareMat (M, N);
}